

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * calculate_global_layer_weights(void)

{
  value_type vVar1;
  int iVar2;
  vector<double,_std::allocator<double>_> *this;
  reference pvVar3;
  reference pvVar4;
  vector<double,_std::allocator<double>_> *in_RDI;
  int right_1;
  int left_1;
  int n;
  int i;
  int right;
  int left;
  vector<double,_std::allocator<double>_> weights;
  vector<double,_std::allocator<double>_> *global_weights;
  int local_ac;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  allocator_type *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  int local_64;
  int local_60;
  double in_stack_ffffffffffffffb0;
  spatial_region *in_stack_ffffffffffffffb8;
  vector<double,_std::allocator<double>_> local_20;
  
  std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
            ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x13fb58);
  spatial_region::calculate_layer_weights(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x13fb82);
  if (mpi_rank == 0) {
    this = (vector<double,_std::allocator<double>_> *)(long)nx_global;
    std::allocator<double>::allocator((allocator<double> *)0x13fbaa);
    std::vector<double,_std::allocator<double>_>::vector
              (this,CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
               in_stack_ffffffffffffff60);
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff60,
               (vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff60);
    std::allocator<double>::~allocator((allocator<double> *)0x13fbe3);
    if (n_sr < 1) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&nx_sr,0);
      vVar1 = *pvVar3;
    }
    else {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&nx_sr,0);
      vVar1 = *pvVar3 - nx_ich / 2;
    }
    for (local_60 = 0; local_60 < vVar1; local_60 = local_60 + 1) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_20,(long)local_60);
      in_stack_ffffffffffffff60 = (allocator_type *)*pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(long)local_60);
      *pvVar4 = (value_type)in_stack_ffffffffffffff60;
    }
    for (local_64 = 1; local_64 < n_sr; local_64 = local_64 + 1) {
      iVar2 = nx_ich / 2;
      if (local_64 == n_sr + -1) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&nx_sr,(long)local_64);
        vVar1 = *pvVar3;
      }
      else {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&nx_sr,(long)local_64);
        vVar1 = *pvVar3 - nx_ich / 2;
      }
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)local_64);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_RDI,(long)(*pvVar3 + iVar2));
      MPI_Recv(pvVar4,vVar1 - iVar2,&ompi_mpi_double,local_64,local_64,&ompi_mpi_comm_world,0);
    }
  }
  else {
    iVar2 = nx_ich / 2;
    if (mpi_rank == n_sr + -1) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&nx_sr,(long)mpi_rank);
      local_ac = *pvVar3;
    }
    else {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&nx_sr,(long)mpi_rank);
      local_ac = *pvVar3 - nx_ich / 2;
    }
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_20,(long)iVar2);
    MPI_Send(pvVar4,local_ac - iVar2,&ompi_mpi_double,0,mpi_rank,&ompi_mpi_comm_world);
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff60);
  return in_RDI;
}

Assistant:

vector<double> calculate_global_layer_weights() {
    auto weights = psr->calculate_layer_weights(balancing_particle_weight);

    vector<double> global_weights;

    if (mpi_rank == 0) {
        global_weights = vector<double>(nx_global);

        int left = 0;
        int right = ((n_sr > 0) ? nx_sr[0] - nx_ich / 2 : nx_sr[0]);

        for (int i = left; i < right; i++) {
            global_weights[i] = weights[i];
        }

        for (int n = 1; n < n_sr; n++) {
            left = nx_ich / 2;
            right = (n == n_sr-1 ? nx_sr[n] : nx_sr[n] - nx_ich / 2);
            MPI_Recv(&(global_weights[x0_sr[n] + left]), right-left, MPI_DOUBLE, n, n, MPI_COMM_WORLD, MPI_STATUS_IGNORE);
        }
    } else {
        int left = nx_ich / 2;
        int right = (mpi_rank == n_sr-1 ? nx_sr[mpi_rank] : nx_sr[mpi_rank] - nx_ich / 2);
        MPI_Send(&(weights[left]), right - left, MPI_DOUBLE, 0, mpi_rank, MPI_COMM_WORLD);
    }

    return global_weights;
}